

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall Logic_Not_Test::~Logic_Not_Test(Logic_Not_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Logic, Not) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = !a\n"
		"let d = !(a < 3)\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);

	INS2(BC_EQ_LP, 0, PRIM_TRUE);
	JMP(3);
	INS2(BC_SET_P, 2, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 2, PRIM_FALSE);

	INS2(BC_LT_LN, 0, 0);
	JMP(3);
	INS2(BC_SET_P, 3, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 3, PRIM_FALSE);

	INS(BC_RET, 0, 0, 0);
}